

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modl.c
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong uVar6;
  char *pcVar7;
  EVP_PKEY_CTX *ctx;
  int option_index;
  char output_filename [8192];
  undefined4 local_4044;
  char *local_4040;
  char local_4038 [8192];
  char local_2038 [8200];
  
  local_4044 = 0;
  if (argc < 2) goto LAB_00110705;
  local_4040 = (char *)0x0;
  while( true ) {
    ctx = (EVP_PKEY_CTX *)(ulong)(uint)argc;
    iVar2 = getopt_long(ctx,argv,":vho:",long_options,&local_4044);
    if (iVar2 != 0x6f) break;
    local_4040 = strdup(_optarg);
  }
  if (iVar2 < 0x3a) {
    if (iVar2 == -1) {
      if (1 < argc - _optind) {
        ctx = (EVP_PKEY_CTX *)argv;
        main_cold_2();
      }
      init(ctx);
      pcVar5 = argv[_optind];
      finname = pcVar5;
      modprefix = strdup(pcVar5);
      pcVar4 = strrchr(modprefix,0x2e);
      strcpy(local_4038,pcVar5);
      if (pcVar4 != (char *)0x0) {
        *pcVar4 = '\0';
      }
      pcVar7 = "r";
      fin = (FILE *)fopen(local_4038,"r");
      pcVar4 = local_4040;
      if ((FILE *)fin == (FILE *)0x0) {
        sprintf(local_4038,"%s.mod",pcVar5);
        sprintf(finname,"%s.mod",pcVar5);
        pcVar7 = "r";
        fin = (FILE *)fopen(local_4038,"r");
        if ((FILE *)fin == (FILE *)0x0) {
          diag("Can\'t open input file: ",local_4038);
        }
      }
      if (pcVar4 == (char *)0x0) {
        sprintf(local_2038,"%s.cpp",modprefix);
LAB_0011069b:
        main_cold_5();
        return 0;
      }
      iVar2 = mkdir_p(pcVar4);
      if (iVar2 == 0) {
        main_cold_4();
        goto LAB_0011069b;
      }
      main_cold_3();
      iVar2 = (int)pcVar4;
      lVar1 = *(long *)(pcVar7 + 8);
      if (iVar2 == 0) {
        if ((*(byte *)(lVar1 + 0x34) & 1) != 0) {
          diag("Multiple declaration of ",*(char **)(lVar1 + 0x48));
        }
        *(byte *)(lVar1 + 0x34) = *(byte *)(lVar1 + 0x34) | 1;
      }
      *(byte *)(lVar1 + 0x34) = *(byte *)(lVar1 + 0x34) | 8;
      pcVar5 = previous_str;
      if ((*(short *)(lVar1 + 0x44) <= iVar2) && (previous_str == (char *)0x0)) {
        __assert_fail("previous_str",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/parsact.c"
                      ,0x77,"void explicit_decl(int, Item *)");
      }
      uVar3 = (uint)*(undefined8 *)(lVar1 + 8);
      if ((~uVar3 & 0x12) == 0) {
        explicit_decl_cold_3();
        uVar6 = extraout_RAX;
LAB_001107e8:
        if ((uVar6 & 1) == 0) {
          *(char **)(lVar1 + 0x28) = previous_str;
        }
        pcVar5 = (char *)(ulong)(uint)(int)*(short *)(lVar1 + 0x44);
        pcVar7 = pcVar5;
        if (*(short *)(lVar1 + 0x44) <= iVar2) goto LAB_001107ff;
      }
      else {
        if ((~uVar3 & 0x18) == 0) {
          explicit_decl_cold_2();
          uVar6 = extraout_RAX_00;
          goto LAB_001107e8;
        }
        if ((~uVar3 & 10) == 0) {
          explicit_decl_cold_1();
          uVar6 = extraout_RAX_01;
          goto LAB_001107e8;
        }
        uVar3 = (uint)*(short *)(lVar1 + 0x44);
        pcVar7 = (char *)(ulong)uVar3;
        if ((int)uVar3 <= iVar2) {
          if ((int)uVar3 < iVar2) {
            *(char **)(lVar1 + 0x28) = previous_str;
          }
          else {
            uVar3 = strcmp(*(char **)(lVar1 + 0x28),previous_str);
            pcVar5 = (char *)(ulong)uVar3;
            if (uVar3 != 0) {
              diag(*(char **)(lVar1 + 0x48)," has different values at same level");
            }
          }
          goto LAB_001107ff;
        }
      }
      pcVar5 = pcVar7;
      *(short *)(lVar1 + 0x44) = (short)pcVar4;
LAB_001107ff:
      return (int)pcVar5;
    }
  }
  else if (iVar2 == 0x3a) {
    main_cold_1();
  }
  else {
    if (iVar2 == 0x68) {
      show_options(argv);
LAB_001106ee:
      exit(0);
    }
    if (iVar2 == 0x76) {
      puts(nmodl_version_);
      goto LAB_001106ee;
    }
  }
  main_cold_6();
LAB_00110705:
  show_options(argv);
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
  int option        = -1;
  int option_index  = 0;
  char* output_dir = NULL;

  if (argc < 2) {
    show_options(argv);
    exit(1);
  }

  while ( (option = getopt_long (argc, argv, ":vho:", long_options, &option_index)) != -1) {
    switch (option) {
      case 'v':
        printf("%s\n", nmodl_version_);
        exit(0);

      case 'o':
        output_dir = strdup(optarg);
        break;

      case 'h':
        show_options(argv);
        exit(0);

      case ':':
        fprintf(stderr, "%s: option '-%c' requires an argument\n", argv[0], optopt);
        exit (-1);

      case '?':
      default:
        fprintf(stderr, "%s: invalid option `-%c' \n", argv[0], optopt);
        exit (-1);
    }
  }
  if ((argc - optind) > 1) {
    fprintf(stderr, "%s: Warning several input files specified on command line but only one will be processed\n", argv[0]);
  }

  init(); /* keywords into symbol table, initialize lists, etc. */
  finname = argv[optind];
  openfiles(finname, output_dir); /* .mrg else .mod,  .var, .c */
  IGNORE(yyparse());
/*
 * At this point all blocks are fully processed except the kinetic
 * block and the solve statements. Even in these cases the 
 * processing doesn't involve syntax since the information is
 * held in intermediate lists of specific structure.
 *
 */
/*
 * go through the list of solve statements and construct the model()
 * code 
 */
  solvhandler();
/* 
 * NAME's can be used in many cases before they were declared and
 * no checking up to this point has been done to make sure that
 * names have been used in only one way.
 *
 */
  consistency();
  chk_thread_safe();
  parout();
  c_out();   /* print .c file */

  IGNORE(fclose(fcout));

  free_global_variables();

#if NMODL && VECTORIZE
  if (vectorize) {
    Fprintf(stderr, "Thread Safe\n");
  }
  if (usederivstatearray) {
    fprintf(stderr, "Derivatives of STATE array variables are not translated correctly and compile time errors will be generated.\n");
    fprintf(stderr, " %s.c file may be manually edited to fix these errors.\n", modprefix);
  }
#endif

#if LINT
{ /* for lex */
  extern int      yytchar, yylineno;
  extern FILE    *yyin;
  IGNORE(yyin);
  IGNORE(yytchar);
  IGNORE(yylineno);
  IGNORE(yyinput());
  yyunput(ilint);
  yyoutput(ilint);
}
#endif
  return 0;
}